

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::add_meshlet_block(CompilerMSL *this,bool per_primitive)

{
  bool bVar1;
  SPIRType *ib_type;
  allocator local_2e1;
  string local_2e0 [32];
  ID local_2c0;
  allocator local_2b9;
  string local_2b8 [32];
  ID local_298;
  allocator local_291;
  string local_290 [32];
  SPIRVariable *local_270;
  SPIRVariable *p_var;
  SPIRVariable **__end1;
  SPIRVariable **__begin1;
  SmallVector<spirv_cross::SPIRVariable_*,_8UL> *__range1;
  InterfaceBlockMeta meta;
  SPIRType *type;
  uint32_t next_id;
  anon_class_24_3_c1682c5a local_90;
  undefined1 local_78 [8];
  SmallVector<spirv_cross::SPIRVariable_*,_8UL> vars;
  bool per_primitive_local;
  CompilerMSL *this_local;
  
  vars.stack_storage.aligned_char[0x3f] = per_primitive;
  SmallVector<spirv_cross::SPIRVariable_*,_8UL>::SmallVector
            ((SmallVector<spirv_cross::SPIRVariable_*,_8UL> *)local_78);
  local_90.per_primitive = (bool *)(vars.stack_storage.aligned_char + 0x3f);
  local_90.this = this;
  local_90.vars = (SmallVector<spirv_cross::SPIRVariable_*,_8UL> *)local_78;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerMSL::add_meshlet_block(bool)::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_90);
  bVar1 = VectorView<spirv_cross::SPIRVariable_*>::empty
                    ((VectorView<spirv_cross::SPIRVariable_*> *)local_78);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    SPIRType::SPIRType((SPIRType *)&meta.strip_array,OpTypeStruct);
    ib_type = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType>
                        ((Compiler *)this,this_local._4_4_,(SPIRType *)&meta.strip_array);
    SPIRType::~SPIRType((SPIRType *)&meta.strip_array);
    ib_type->basetype = Struct;
    InterfaceBlockMeta::InterfaceBlockMeta((InterfaceBlockMeta *)&__range1);
    __begin1 = (SPIRVariable **)local_78;
    __end1 = VectorView<spirv_cross::SPIRVariable_*>::begin
                       ((VectorView<spirv_cross::SPIRVariable_*> *)__begin1);
    p_var = (SPIRVariable *)
            VectorView<spirv_cross::SPIRVariable_*>::end
                      ((VectorView<spirv_cross::SPIRVariable_*> *)__begin1);
    for (; (SPIRVariable *)__end1 != p_var; __end1 = __end1 + 1) {
      local_270 = *__end1;
      meta.location_meta._M_h._M_single_bucket._0_1_ = 1;
      meta.location_meta._M_h._M_single_bucket._1_1_ = 0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_290,"",&local_291);
      add_variable_to_interface_block
                (this,StorageClassOutput,(string *)local_290,ib_type,local_270,
                 (InterfaceBlockMeta *)&__range1);
      ::std::__cxx11::string::~string(local_290);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_291);
    }
    if ((vars.stack_storage.aligned_char[0x3f] & 1U) == 0) {
      local_2c0.id = (ib_type->super_IVariant).self.id;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2e0,"spvPerVertex",&local_2e1);
      Compiler::set_name((Compiler *)this,local_2c0,(string *)local_2e0);
      ::std::__cxx11::string::~string(local_2e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    }
    else {
      local_298.id = (ib_type->super_IVariant).self.id;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b8,"spvPerPrimitive",&local_2b9);
      Compiler::set_name((Compiler *)this,local_298,(string *)local_2b8);
      ::std::__cxx11::string::~string(local_2b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    }
    InterfaceBlockMeta::~InterfaceBlockMeta((InterfaceBlockMeta *)&__range1);
  }
  SmallVector<spirv_cross::SPIRVariable_*,_8UL>::~SmallVector
            ((SmallVector<spirv_cross::SPIRVariable_*,_8UL> *)local_78);
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::add_meshlet_block(bool per_primitive)
{
	// Accumulate the variables that should appear in the interface struct.
	SmallVector<SPIRVariable *> vars;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (var.storage != StorageClassOutput || var.self == builtin_mesh_primitive_indices_id)
			return;
		if (is_per_primitive_variable(var) != per_primitive)
			return;
		vars.push_back(&var);
	});

	if (vars.empty())
		return 0;

	uint32_t next_id = ir.increase_bound_by(1);
	auto &type = set<SPIRType>(next_id, SPIRType(OpTypeStruct));
	type.basetype = SPIRType::Struct;

	InterfaceBlockMeta meta;
	for (auto *p_var : vars)
	{
		meta.strip_array = true;
		meta.allow_local_declaration = false;
		add_variable_to_interface_block(StorageClassOutput, "", type, *p_var, meta);
	}

	if (per_primitive)
		set_name(type.self, "spvPerPrimitive");
	else
		set_name(type.self, "spvPerVertex");

	return next_id;
}